

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

ip_filter * __thiscall libtorrent::aux::session_impl::get_ip_filter(session_impl *this)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<libtorrent::ip_filter> local_20;
  session_impl *local_10;
  session_impl *this_local;
  
  local_10 = this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter);
  if (!bVar1) {
    ::std::make_shared<libtorrent::ip_filter>();
    ::std::shared_ptr<libtorrent::ip_filter>::operator=(&this->m_ip_filter,&local_20);
    ::std::shared_ptr<libtorrent::ip_filter>::~shared_ptr(&local_20);
  }
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->m_ip_filter);
  return peVar2;
}

Assistant:

ip_filter const& session_impl::get_ip_filter()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_ip_filter) m_ip_filter = std::make_shared<ip_filter>();
		return *m_ip_filter;
	}